

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlSetShader(uint id,int *locs)

{
  if (RLGL.State.currentShaderId != id) {
    rlDrawRenderBatch(RLGL.currentBatch);
    RLGL.State.currentShaderId = id;
    RLGL.State.currentShaderLocs = locs;
  }
  return;
}

Assistant:

void rlSetShader(unsigned int id, int *locs)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if (RLGL.State.currentShaderId != id)
    {
        rlDrawRenderBatch(RLGL.currentBatch);
        RLGL.State.currentShaderId = id;
        RLGL.State.currentShaderLocs = locs;
    }
#endif
}